

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::saveProgramOptionsHash(CLIntercept *this,cl_program program,char *options)

{
  mutex *__mutex;
  int iVar1;
  size_t length;
  uint64_t uVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  CLIntercept *this_00;
  cl_program local_28;
  
  __mutex = &this->m_Mutex;
  local_28 = program;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (options != (char *)0x0 && program != (cl_program)0x0) {
      this_00 = (CLIntercept *)options;
      length = strlen(options);
      uVar2 = computeHash(this_00,options,length);
      pmVar3 = std::
               map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
               ::operator[](&this->m_ProgramInfoMap,&local_28);
      pmVar3->OptionsHash = uVar2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar4 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

void CLIntercept::saveProgramOptionsHash(
    const cl_program program,
    const char* options )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( program != NULL && options != NULL )
    {
        uint64_t hash = computeHash(
            options,
            strlen( options ) );

        m_ProgramInfoMap[ program ].OptionsHash = hash;
    }
}